

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

void __thiscall
MainWindow::configureActions(MainWindow *this,QWidget *widget,ShortcutTable *shortcuts)

{
  QAction *this_00;
  bool bVar1;
  byte bVar2;
  iterator o;
  QAction **ppQVar3;
  undefined1 local_a0 [16];
  QVariant _data;
  QMenu *menu;
  QAction *act;
  iterator __end1;
  iterator local_48;
  iterator __begin1;
  QList<QAction_*> *__range1;
  ShortcutTable *shortcuts_local;
  QWidget *widget_local;
  MainWindow *this_local;
  
  QWidget::actions();
  local_48 = QList<QAction_*>::begin((QList<QAction_*> *)&__begin1);
  o = QList<QAction_*>::end((QList<QAction_*> *)&__begin1);
  while (bVar1 = QList<QAction_*>::iterator::operator!=(&local_48,o), bVar1) {
    ppQVar3 = QList<QAction_*>::iterator::operator*(&local_48);
    this_00 = *ppQVar3;
    bVar2 = QAction::isSeparator();
    if ((bVar2 & 1) == 0) {
      _data.d._24_8_ = QAction::menu<QMenu*>(this_00);
      if ((QMenu *)_data.d._24_8_ == (QMenu *)0x0) {
        QAction::data();
        bVar1 = QVariant::canConvert<ShortcutTable::Shortcut>((QVariant *)(local_a0 + 8));
        if (bVar1) {
          QVariant::value<ShortcutTable::Shortcut>((QVariant *)(local_a0 + 8));
          ShortcutTable::get((ShortcutTable *)local_a0,(Shortcut)shortcuts);
          QAction::setShortcut((QKeySequence *)this_00);
          QKeySequence::~QKeySequence((QKeySequence *)local_a0);
        }
        QVariant::~QVariant((QVariant *)(local_a0 + 8));
      }
      else {
        configureActions(this,(QWidget *)_data.d._24_8_,shortcuts);
      }
    }
    QList<QAction_*>::iterator::operator++(&local_48);
  }
  QList<QAction_*>::~QList((QList<QAction_*> *)&__begin1);
  return;
}

Assistant:

void MainWindow::configureActions(QWidget &widget, ShortcutTable const& shortcuts) {
    for (auto act : widget.actions()) {
        if (act->isSeparator()) {
            continue;
        } else if (auto menu = act->menu(); menu) {
            // recurse into this menu
            configureActions(*menu, shortcuts);
        } else {
            // check if this action has a shortcut
            auto const _data = act->data();
            if (_data.canConvert<ShortcutTable::Shortcut>()) {
                // yes, set the action's shortcut from the configuration
                act->setShortcut(shortcuts.get(_data.value<ShortcutTable::Shortcut>()));
            }
        }
    }
}